

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostTorsion.cpp
# Opt level: O2

void __thiscall
OpenMD::GhostTorsion::calcForce(GhostTorsion *this,RealType *angle,bool doParticlePot)

{
  RealType *particlePot;
  pointer ppAVar1;
  Atom *this_00;
  TorsionType *pTVar2;
  Atom *this_01;
  RealType RVar3;
  Vector<double,_3U> *v1;
  double dVar4;
  double s;
  double s_00;
  Vector<double,_3U> local_218;
  Vector<double,_3U> local_200;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  RealType dVdcosPhi;
  Vector3d r43;
  Vector3d r32;
  Vector3d dcosdB;
  Vector3d dcosdA;
  Vector3d r21;
  Vector3d A;
  Vector<double,_3U> local_d8;
  Vector3d B;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  
  ppAVar1 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = ppAVar1[2];
  StuntDouble::getPos((Vector3d *)&pos1.super_Vector<double,_3U>,&(*ppAVar1)->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&pos2.super_Vector<double,_3U>,
                      &(this->super_Torsion).super_ShortRangeInteraction.atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&pos3.super_Vector<double,_3U>,&this_00->super_StuntDouble);
  operator-(&A.super_Vector<double,_3U>,&pos1.super_Vector<double,_3U>,
            &pos2.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&r21.super_Vector<double,_3U>,&A.super_Vector<double,_3U>);
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             (Vector3d *)&r21.super_Vector<double,_3U>);
  operator-(&A.super_Vector<double,_3U>,&pos2.super_Vector<double,_3U>,
            &pos3.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&r32.super_Vector<double,_3U>,&A.super_Vector<double,_3U>);
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             (Vector3d *)&r32.super_Vector<double,_3U>);
  StuntDouble::getA((RotMat3x3d *)&B,&this_00->super_StuntDouble);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&A,(RotMat3x3d *)&B);
  RectMatrix<double,_3U,_3U>::getColumn
            (&dcosdA.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&A,2);
  Vector<double,_3U>::Vector(&r43.super_Vector<double,_3U>,&dcosdA.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&A.super_Vector<double,_3U>,
                (Vector3<double> *)&r21.super_Vector<double,_3U>,
                (Vector3<double> *)&r32.super_Vector<double,_3U>);
  dVar4 = Vector<double,_3U>::length(&A.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&B.super_Vector<double,_3U>,
                (Vector3<double> *)&r32.super_Vector<double,_3U>,
                (Vector3<double> *)&r43.super_Vector<double,_3U>);
  s = Vector<double,_3U>::length(&B.super_Vector<double,_3U>);
  if (1e-06 <= dVar4 * s) {
    Vector<double,_3U>::normalize(&A.super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&B.super_Vector<double,_3U>);
    s_00 = dot<double,3u>(&A.super_Vector<double,_3U>,&B.super_Vector<double,_3U>);
    pTVar2 = (this->super_Torsion).torsionType_;
    particlePot = &(this->super_Torsion).potential_;
    (*pTVar2->_vptr_TorsionType[2])(pTVar2,particlePot,&dVdcosPhi);
    operator*(&f2.super_Vector<double,_3U>,s_00,&A.super_Vector<double,_3U>);
    operator-(&f1.super_Vector<double,_3U>,&f2.super_Vector<double,_3U>,&B.super_Vector<double,_3U>)
    ;
    operator/(&dcosdB.super_Vector<double,_3U>,&f1.super_Vector<double,_3U>,dVar4);
    Vector<double,_3U>::Vector(&dcosdA.super_Vector<double,_3U>,&dcosdB.super_Vector<double,_3U>);
    operator*(&f3.super_Vector<double,_3U>,s_00,&B.super_Vector<double,_3U>);
    operator-(&f2.super_Vector<double,_3U>,&f3.super_Vector<double,_3U>,&A.super_Vector<double,_3U>)
    ;
    operator/(&f1.super_Vector<double,_3U>,&f2.super_Vector<double,_3U>,s);
    Vector<double,_3U>::Vector(&dcosdB.super_Vector<double,_3U>,&f1.super_Vector<double,_3U>);
    RVar3 = dVdcosPhi;
    cross<double>((Vector3<double> *)&f3.super_Vector<double,_3U>,&r32,
                  (Vector3<double> *)&dcosdA.super_Vector<double,_3U>);
    operator*(&f2.super_Vector<double,_3U>,RVar3,&f3.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&f1.super_Vector<double,_3U>,&f2.super_Vector<double,_3U>);
    RVar3 = dVdcosPhi;
    cross<double>((Vector3<double> *)&local_200,&r43,
                  (Vector3<double> *)&dcosdB.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&local_d8,&r21,
                  (Vector3<double> *)&dcosdA.super_Vector<double,_3U>);
    operator-(&local_218,&local_200,&local_d8);
    operator*(&f3.super_Vector<double,_3U>,RVar3,&local_218);
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&f2,&f3.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&local_200,(Vector3<double> *)&dcosdB.super_Vector<double,_3U>,
                  &r32);
    operator*(&local_218,dVdcosPhi,&local_200);
    Vector<double,_3U>::Vector(&f3.super_Vector<double,_3U>,&local_218);
    StuntDouble::addFrc(&(*(this->super_Torsion).super_ShortRangeInteraction.atoms_.
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble,
                        (Vector3d *)&f1.super_Vector<double,_3U>);
    this_01 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start[1];
    operator-(&local_200,(Vector<double,_3U> *)&f2,&f1.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&local_218,&local_200);
    StuntDouble::addFrc(&this_01->super_StuntDouble,(Vector3d *)&local_218);
    operator-(&local_200,(OpenMD *)&f2,v1);
    Vector<double,_3U>::Vector(&local_218,&local_200);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&local_218);
    Vector<double,_3U>::negate(&f3.super_Vector<double,_3U>);
    cross<double>((Vector3<double> *)&local_218,&r43,(Vector3<double> *)&f3.super_Vector<double,_3U>
                 );
    StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)&local_218);
    if (doParticlePot) {
      StuntDouble::addParticlePot
                (&(*(this->super_Torsion).super_ShortRangeInteraction.atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->super_StuntDouble,particlePot);
      StuntDouble::addParticlePot
                (&(this->super_Torsion).super_ShortRangeInteraction.atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start[1]->super_StuntDouble,particlePot);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,particlePot);
    }
    dVar4 = acos(s_00);
    *angle = (dVar4 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void GhostTorsion::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[2]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = ghostAtom->getA().transpose().getColumn(2);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    Vector3d f1 = dVdcosPhi * cross(r32, dcosdA);
    Vector3d f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    Vector3d f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);

    ghostAtom->addFrc(-f2);

    f3.negate();
    ghostAtom->addTrq(cross(r43, f3));

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }